

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O0

bool pvmath::haarTransform<float>(void)

{
  bool bVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  vector<float,_std::allocator<float>_> *pvVar7;
  double dVar8;
  size_t id_1;
  vector<float,_std::allocator<float>_> inverse;
  size_t id;
  vector<float,_std::allocator<float>_> direct;
  vector<float,_std::allocator<float>_> input;
  uint32_t height;
  uint32_t width;
  uint32_t i;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  value_type in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff18;
  allocator_type *in_stack_ffffffffffffff20;
  undefined1 *in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  vector<float,_std::allocator<float>_> *local_90;
  undefined1 local_81;
  vector<float,_std::allocator<float>_> local_80;
  ulong local_68;
  vector<float,_std::allocator<float>_> local_58 [2];
  vector<float,_std::allocator<float>_> local_28;
  int local_10;
  int local_c;
  uint local_8;
  byte local_1;
  
  for (local_8 = 0; uVar4 = local_8, uVar3 = Test_Helper::runCount(), uVar4 < uVar3;
      local_8 = local_8 + 1) {
    uVar4 = Test_Helper::randomValue<unsigned_int>
                      ((uint)in_stack_ffffffffffffff10,(uint32_t)in_stack_ffffffffffffff0c);
    local_c = uVar4 * 2;
    uVar4 = Test_Helper::randomValue<unsigned_int>
                      ((uint)in_stack_ffffffffffffff10,(uint32_t)in_stack_ffffffffffffff0c);
    local_10 = uVar4 * 2;
    std::allocator<float>::allocator((allocator<float> *)0x24b3de);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (size_type)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::allocator<float>::~allocator((allocator<float> *)0x24b404);
    std::allocator<float>::allocator((allocator<float> *)0x24b42c);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (size_type)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::allocator<float>::~allocator((allocator<float> *)0x24b452);
    for (local_68 = 0; uVar2 = local_68,
        sVar5 = std::vector<float,_std::allocator<float>_>::size(&local_28), uVar2 < sVar5;
        local_68 = local_68 + 1) {
      in_stack_ffffffffffffff30 =
           Unit_Test::randomFloatValue<float>
                     (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
      ;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&local_28,local_68);
      *pvVar6 = in_stack_ffffffffffffff30;
      in_stack_ffffffffffffff34 =
           Unit_Test::randomFloatValue<float>
                     (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
      ;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](local_58,local_68);
      *pvVar6 = in_stack_ffffffffffffff34;
    }
    in_stack_ffffffffffffff20 = (allocator_type *)(ulong)(uint)(local_c * local_10);
    in_stack_ffffffffffffff28 = &local_81;
    std::allocator<float>::allocator((allocator<float> *)0x24b58f);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (size_type)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::allocator<float>::~allocator((allocator<float> *)0x24b5af);
    Image_Function::HaarDirectTransform
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    Image_Function::HaarInverseTransform
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_90 = (vector<float,_std::allocator<float>_> *)0x0;
    while (in_stack_ffffffffffffff18 = local_90,
          pvVar7 = (vector<float,_std::allocator<float>_> *)
                   std::vector<float,_std::allocator<float>_>::size(&local_28),
          in_stack_ffffffffffffff18 < pvVar7) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&local_28,(size_type)local_90)
      ;
      in_stack_ffffffffffffff10 = *pvVar6;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&local_80,(size_type)local_90)
      ;
      dVar8 = std::fabs((double)(ulong)(uint)(in_stack_ffffffffffffff10 - *pvVar6));
      in_stack_ffffffffffffff14 = SUB84(dVar8,0);
      if (0.001 < in_stack_ffffffffffffff14) {
        local_1 = 0;
        bVar1 = true;
        goto LAB_0024b6fb;
      }
      local_90 = (vector<float,_std::allocator<float>_> *)
                 ((long)&(local_90->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
    bVar1 = false;
LAB_0024b6fb:
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff20);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff20);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff20);
    if (bVar1) goto LAB_0024b767;
  }
  local_1 = 1;
LAB_0024b767:
  return (bool)(local_1 & 1);
}

Assistant:

bool haarTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width  = Unit_Test::randomValue<uint32_t>( 16u, 256u ) * 2; // to make sure that number is divided by 2
            const uint32_t height = Unit_Test::randomValue<uint32_t>( 16u, 256u ) * 2;
            std::vector< _Type > input ( width * height );
            std::vector< _Type > direct( width * height );

            for ( size_t id = 0; id < input.size(); ++id ) {
                input [id] = Unit_Test::randomFloatValue<_Type>( 0, 255, 1.0f );
                direct[id] = Unit_Test::randomFloatValue<_Type>( 0, 255, 1.0f );
            }

            std::vector< _Type > inverse ( width * height );
            Image_Function::HaarDirectTransform ( input, direct, width, height );
            Image_Function::HaarInverseTransform( direct, inverse, width, height );

            for ( size_t id = 0; id < input.size(); ++id ) {
                if (std::fabs(input[id] - inverse[id]) > 0.001f)
                    return false;
            }
        }

        return true;
    }